

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

boolean In_W_tower(level *lev,int x,int y)

{
  char cVar1;
  boolean bVar2;
  
  bVar2 = On_W_tower_level(&lev->z);
  if (bVar2 != '\0') {
    cVar1 = (lev->dndest).nlx;
    if (cVar1 < '\x01') {
      impossible("No boundary for Wizard\'s Tower?");
      return '\0';
    }
    if (((cVar1 <= x) && (x <= (lev->dndest).nhx)) && ((lev->dndest).nly <= y)) {
      return y <= (lev->dndest).nhy;
    }
  }
  return '\0';
}

Assistant:

boolean In_W_tower(const struct level *lev, int x, int y)
{
	if (!On_W_tower_level(&lev->z)) return FALSE;
	/*
	 * Both of the exclusion regions for arriving via level teleport
	 * (from above or below) define the tower's boundary.
	 *	assert( updest.nIJ == dndest.nIJ for I={l|h},J={x|y} );
	 */
	if (lev->dndest.nlx > 0)
	    return (boolean)within_bounded_area(x, y, lev->dndest.nlx, lev->dndest.nly,
						lev->dndest.nhx, lev->dndest.nhy);
	else
	    impossible("No boundary for Wizard's Tower?");
	return FALSE;
}